

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_raw_utf8(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  FILE *__stream;
  bson_iter_t iter;
  undefined1 auStack_100 [232];
  
  lVar3 = bson_new_from_json(anon_var_dwarf_15497,0xffffffffffffffff,0);
  if (lVar3 == 0) {
    pcVar4 = "bson";
    uVar5 = 0x40d;
  }
  else {
    cVar1 = bson_iter_init_find(auStack_100,lVar3,anon_var_dwarf_47a2 + 0xc);
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init_find (&iter, bson, EU)";
      uVar5 = 0x40e;
      goto LAB_001220f6;
    }
    pcVar4 = (char *)bson_iter_key(auStack_100);
    if (pcVar4 != anon_var_dwarf_47a2 + 0xc) {
      pcVar4 = (char *)bson_iter_key(auStack_100);
      iVar2 = strcmp(pcVar4,anon_var_dwarf_47a2 + 0xc);
      __stream = _stderr;
      if (iVar2 != 0) {
        uVar5 = bson_iter_key(auStack_100);
        goto LAB_0012212a;
      }
    }
    pcVar4 = (char *)bson_iter_utf8(auStack_100,0);
    if (pcVar4 != anon_var_dwarf_47a2 + 0xc) {
      pcVar4 = (char *)bson_iter_utf8(auStack_100,0);
      iVar2 = strcmp(pcVar4,anon_var_dwarf_47a2 + 0xc);
      __stream = _stderr;
      if (iVar2 != 0) {
        uVar5 = bson_iter_utf8(auStack_100,0);
LAB_0012212a:
        fprintf(__stream,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",uVar5,
                anon_var_dwarf_47a2 + 0xc);
        abort();
      }
    }
    cVar1 = bson_iter_next(auStack_100);
    if (cVar1 == '\0') {
      bson_destroy(lVar3);
      return;
    }
    pcVar4 = "!bson_iter_next (&iter)";
    uVar5 = 0x411;
  }
LAB_001220f6:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_json_read_raw_utf8",pcVar4);
  abort();
}

Assistant:

static void
test_bson_json_read_raw_utf8 (void)
{
   bson_t *bson;
   bson_iter_t iter;

   bson = bson_new_from_json (
      (const uint8_t *) "{\"" EU "\": \"" EU "\"}", -1, NULL);
   ASSERT (bson);
   ASSERT (bson_iter_init_find (&iter, bson, EU));
   ASSERT_CMPSTR (bson_iter_key (&iter), EU);
   ASSERT_CMPSTR (bson_iter_utf8 (&iter, NULL), EU);
   ASSERT (!bson_iter_next (&iter));

   bson_destroy (bson);
}